

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::setMinimalDaysInFirstWeek(Calendar *this,uint8_t value)

{
  uint8_t local_11;
  uint8_t value_local;
  Calendar *this_local;
  
  if (value == '\0') {
    local_11 = '\x01';
  }
  else {
    local_11 = value;
    if (7 < value) {
      local_11 = '\a';
    }
  }
  if (this->fMinimalDaysInFirstWeek != local_11) {
    this->fMinimalDaysInFirstWeek = local_11;
    this->fAreFieldsSet = '\0';
  }
  return;
}

Assistant:

void
Calendar::setMinimalDaysInFirstWeek(uint8_t value)
{
    // Values less than 1 have the same effect as 1; values greater
    // than 7 have the same effect as 7. However, we normalize values
    // so operator== and so forth work.
    if (value < 1) {
        value = 1;
    } else if (value > 7) {
        value = 7;
    }
    if (fMinimalDaysInFirstWeek != value) {
        fMinimalDaysInFirstWeek = value;
        fAreFieldsSet = FALSE;
    }
}